

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O1

Literal * __thiscall
wasm::Literal::minF64x2(Literal *__return_storage_ptr__,Literal *this,Literal *other)

{
  Type *__return_storage_ptr___00;
  long lVar1;
  Literal *this_00;
  undefined1 local_a0 [8];
  LaneArray<2> other_lanes;
  undefined1 local_58 [8];
  LaneArray<2> lanes;
  
  getLanesF64x2((LaneArray<2> *)local_58,this);
  getLanesF64x2((LaneArray<2> *)local_a0,other);
  lVar1 = 0;
  __return_storage_ptr___00 = &other_lanes._M_elems[1].type;
  do {
    this_00 = (Literal *)(local_58 + lVar1);
    min((Literal *)__return_storage_ptr___00,this_00,(Literal *)(local_a0 + lVar1));
    if (this_00 != (Literal *)__return_storage_ptr___00) {
      ~Literal(this_00);
      Literal(this_00,(Literal *)__return_storage_ptr___00);
    }
    ~Literal((Literal *)__return_storage_ptr___00);
    lVar1 = lVar1 + 0x18;
  } while (lVar1 == 0x18);
  Literal(__return_storage_ptr__,(LaneArray<2> *)local_58);
  lVar1 = 0x18;
  do {
    ~Literal((Literal *)(local_a0 + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  lVar1 = 0x18;
  do {
    ~Literal((Literal *)(local_58 + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::minF64x2(const Literal& other) const {
  return binary<2, &Literal::getLanesF64x2, &Literal::min>(*this, other);
}